

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QMovableArrayOps<QModelIndex>::emplace<QModelIndex_const&>
          (QMovableArrayOps<QModelIndex> *this,qsizetype i,QModelIndex *args)

{
  QModelIndex **ppQVar1;
  QModelIndex *pQVar2;
  int iVar3;
  int iVar4;
  Data *pDVar5;
  long lVar6;
  quintptr qVar7;
  QAbstractItemModel *pQVar8;
  QModelIndex *pQVar9;
  qsizetype *pqVar10;
  bool bVar11;
  
  pDVar5 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.d;
  if ((pDVar5 == (Data *)0x0) ||
     (1 < (__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>)) {
LAB_003e7e58:
    iVar3 = args->r;
    iVar4 = args->c;
    qVar7 = args->i;
    pQVar8 = (args->m).ptr;
    bVar11 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size
             != 0;
    QArrayDataPointer<QModelIndex>::detachAndGrow
              ((QArrayDataPointer<QModelIndex> *)this,(uint)(i == 0 && bVar11),1,(QModelIndex **)0x0
               ,(QArrayDataPointer<QModelIndex> *)0x0);
    pQVar9 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
    if (i != 0 || !bVar11) {
      pQVar2 = pQVar9 + i;
      memmove(pQVar2 + 1,pQVar9 + i,
              ((this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size
              - i) * 0x18);
      pQVar2->r = iVar3;
      pQVar2->c = iVar4;
      pQVar2->i = qVar7;
      (pQVar2->m).ptr = pQVar8;
      goto LAB_003e7f08;
    }
    pQVar9[-1].r = iVar3;
    pQVar9[-1].c = iVar4;
    pQVar9[-1].i = qVar7;
    pQVar9[-1].m.ptr = pQVar8;
  }
  else {
    lVar6 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size;
    if ((lVar6 == i && pDVar5 != (Data *)0x0) &&
       ((pDVar5->super_QArrayData).alloc - lVar6 !=
        ((long)((long)(this->super_QGenericArrayOps<QModelIndex>).
                      super_QArrayDataPointer<QModelIndex>.ptr -
               ((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 3) *
        -0x5555555555555555)) {
      pQVar9 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
      pQVar9[lVar6].m.ptr = (args->m).ptr;
      iVar3 = args->c;
      qVar7 = args->i;
      pQVar9 = pQVar9 + lVar6;
      pQVar9->r = args->r;
      pQVar9->c = iVar3;
      pQVar9->i = qVar7;
      goto LAB_003e7f08;
    }
    if (((i != 0) || (pDVar5 == (Data *)0x0)) ||
       ((QModelIndex *)((ulong)((long)&pDVar5[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
        == (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr))
    goto LAB_003e7e58;
    pQVar9 = (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
    pQVar9[-1].m.ptr = (args->m).ptr;
    iVar3 = args->c;
    qVar7 = args->i;
    pQVar9[-1].r = args->r;
    pQVar9[-1].c = iVar3;
    pQVar9[-1].i = qVar7;
  }
  ppQVar1 = &(this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr;
  *ppQVar1 = *ppQVar1 + -1;
LAB_003e7f08:
  pqVar10 = &(this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.size;
  *pqVar10 = *pqVar10 + 1;
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }